

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationSmokeTests.cpp
# Opt level: O0

void vkt::synchronization::anon_unknown_0::createVulkanBuffer
               (DeviceInterface *vkd,VkDevice device,Allocator *allocator,
               BufferParameters *bufferParameters,Buffer *buffer,MemoryRequirement visibility)

{
  deUint64 dVar1;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  RefData<vk::Handle<(vk::HandleType)8>_> data_00;
  VkResult VVar2;
  Handle<(vk::HandleType)8> *pHVar3;
  Allocation *pAVar4;
  VkDeviceMemory VVar5;
  VkDeviceSize VVar6;
  void *dst;
  undefined1 local_158 [8];
  VkMappedMemoryRange range;
  VkMemoryBarrier barrier;
  VkMemoryRequirements local_f8;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_e0;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_d0;
  Move<vk::Handle<(vk::HandleType)8>_> local_b0;
  RefData<vk::Handle<(vk::HandleType)8>_> local_90;
  undefined1 local_70 [8];
  VkBufferCreateInfo bufferCreateParams;
  Buffer *buffer_local;
  BufferParameters *bufferParameters_local;
  Allocator *allocator_local;
  VkDevice device_local;
  DeviceInterface *vkd_local;
  MemoryRequirement visibility_local;
  
  bufferCreateParams.pQueueFamilyIndices = (deUint32 *)buffer;
  ::deMemset((VkBufferCreateInfo *)local_70,0xcd,0x38);
  local_70._0_4_ = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  bufferCreateParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  bufferCreateParams._4_4_ = 0;
  bufferCreateParams.pNext._0_4_ = 0;
  bufferCreateParams._16_8_ = bufferParameters->size;
  bufferCreateParams.size._0_4_ = bufferParameters->usage;
  bufferCreateParams.size._4_4_ = bufferParameters->sharingMode;
  bufferCreateParams.usage = bufferParameters->queueFamilyCount;
  bufferCreateParams._40_8_ = bufferParameters->queueFamilyIndex;
  ::vk::createBuffer(&local_b0,vkd,device,(VkBufferCreateInfo *)local_70,
                     (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_90,(Move *)&local_b0);
  data_00.deleter.m_deviceIface = local_90.deleter.m_deviceIface;
  data_00.object.m_internal = local_90.object.m_internal;
  data_00.deleter.m_device = local_90.deleter.m_device;
  data_00.deleter.m_allocator = local_90.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::operator=
            ((Move<vk::Handle<(vk::HandleType)8>_> *)(bufferCreateParams.pQueueFamilyIndices + 10),
             data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_b0);
  pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                      (bufferCreateParams.pQueueFamilyIndices + 10));
  ::vk::getBufferMemoryRequirements(&local_f8,vkd,device,(VkBuffer)pHVar3->m_internal);
  (*allocator->_vptr_Allocator[3])(&local_e0,allocator,&local_f8,(ulong)visibility.m_flags);
  local_d0 = de::details::MovePtr::operator_cast_to_PtrData(&local_e0,(MovePtr *)allocator);
  data._8_8_ = local_90.deleter.m_deviceIface;
  data.ptr = (Allocation *)local_90.object.m_internal;
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator=
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
             bufferCreateParams.pQueueFamilyIndices,data);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_e0);
  pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)8>_> *)
                      (bufferCreateParams.pQueueFamilyIndices + 10));
  dVar1 = pHVar3->m_internal;
  pAVar4 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                      bufferCreateParams.pQueueFamilyIndices);
  VVar5 = ::vk::Allocation::getMemory(pAVar4);
  pAVar4 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     ((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                      bufferCreateParams.pQueueFamilyIndices);
  VVar6 = ::vk::Allocation::getOffset(pAVar4);
  VVar2 = (*vkd->_vptr_DeviceInterface[0xc])(vkd,device,dVar1,VVar5.m_internal,VVar6);
  ::vk::checkResult(VVar2,
                    "vkd.bindBufferMemory(device, *buffer.buffer, buffer.allocation->getMemory(), buffer.allocation->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationSmokeTests.cpp"
                    ,0xb1);
  if (bufferParameters->memory != (void *)0x0) {
    ::vk::VkMappedMemoryRange::VkMappedMemoryRange((VkMappedMemoryRange *)local_158);
    ::deMemset(local_158,0xcd,0x28);
    local_158._0_4_ = VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE;
    range.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    range._4_4_ = 0;
    pAVar4 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
             operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                        bufferCreateParams.pQueueFamilyIndices);
    range.pNext = (void *)::vk::Allocation::getMemory(pAVar4);
    pAVar4 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
             operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                        bufferCreateParams.pQueueFamilyIndices);
    range.memory.m_internal = ::vk::Allocation::getOffset(pAVar4);
    range.offset = bufferParameters->size;
    pAVar4 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
             operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                        bufferCreateParams.pQueueFamilyIndices);
    dst = ::vk::Allocation::getHostPtr(pAVar4);
    ::deMemcpy(dst,bufferParameters->memory,bufferParameters->size);
    VVar2 = (*vkd->_vptr_DeviceInterface[9])(vkd,device,1,local_158);
    ::vk::checkResult(VVar2,"vkd.flushMappedMemoryRanges(device, 1, &range)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationSmokeTests.cpp"
                      ,0xc3);
    ::deMemset(&range.size,0xcd,0x18);
    range.size._0_4_ = 0x2e;
    std::vector<vk::VkMemoryBarrier,_std::allocator<vk::VkMemoryBarrier>_>::push_back
              ((vector<vk::VkMemoryBarrier,_std::allocator<vk::VkMemoryBarrier>_> *)
               (bufferCreateParams.pQueueFamilyIndices + 4),(value_type *)&range.size);
  }
  return;
}

Assistant:

void createVulkanBuffer (const DeviceInterface& vkd, VkDevice device, Allocator& allocator, const BufferParameters& bufferParameters, Buffer& buffer, MemoryRequirement visibility)
{
	VkBufferCreateInfo	bufferCreateParams;

	deMemset(&bufferCreateParams, 0xcd, sizeof(bufferCreateParams));
	bufferCreateParams.sType					= VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
	bufferCreateParams.pNext					= DE_NULL;
	bufferCreateParams.flags					= 0;
	bufferCreateParams.size						= bufferParameters.size;
	bufferCreateParams.usage					= bufferParameters.usage;
	bufferCreateParams.sharingMode				= bufferParameters.sharingMode;
	bufferCreateParams.queueFamilyIndexCount	= bufferParameters.queueFamilyCount;
	bufferCreateParams.pQueueFamilyIndices		= bufferParameters.queueFamilyIndex;

	buffer.buffer		= createBuffer(vkd, device, &bufferCreateParams);
	buffer.allocation	= allocator.allocate(getBufferMemoryRequirements(vkd, device, *buffer.buffer), visibility);

	VK_CHECK(vkd.bindBufferMemory(device, *buffer.buffer, buffer.allocation->getMemory(), buffer.allocation->getOffset()));

	// If caller provides a host memory buffer for the allocation, then go
	// ahead and copy the provided data into the allocation and update the
	// barrier list with the associated access
	if (bufferParameters.memory != DE_NULL)
	{
		VkMemoryBarrier				barrier;
		VkMappedMemoryRange			range;

		deMemset(&range, 0xcd, sizeof(range));
		range.sType		= VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE;
		range.pNext		= DE_NULL;
		range.memory	= buffer.allocation->getMemory();
		range.offset	= buffer.allocation->getOffset();
		range.size		= bufferParameters.size;

		deMemcpy(buffer.allocation->getHostPtr(), bufferParameters.memory, (size_t)bufferParameters.size);
		VK_CHECK(vkd.flushMappedMemoryRanges(device, 1, &range));

		deMemset(&barrier, 0xcd, sizeof(barrier));
		barrier.sType			= VK_STRUCTURE_TYPE_MEMORY_BARRIER;
		barrier.pNext			= DE_NULL;
		barrier.srcAccessMask	= VK_ACCESS_HOST_WRITE_BIT;
		barrier.dstAccessMask	= bufferParameters.inputBarrierFlags;

		buffer.memoryBarrier.push_back(barrier);
	}
}